

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

wchar_t assertion_chmod(char *file,wchar_t line,char *pathname,wchar_t mode)

{
  int iVar1;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar1 = chmod(pathname,mode);
  if (iVar1 != 0) {
    failure_start(file,line,"chmod(\"%s\", %4.o)",pathname,(ulong)(uint)mode);
    failure_finish((void *)0x0);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

int
assertion_chmod(const char *file, int line, const char *pathname, int mode)
{
	assertion_count(file, line);
	if (chmod(pathname, (mode_t)mode) == 0)
		return (1);
	failure_start(file, line, "chmod(\"%s\", %4.o)", pathname,
	    (unsigned int)mode);
	failure_finish(NULL);
	return (0);

}